

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

ostream * pstack::operator<<(ostream *os,
                            JSON<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
                            *json)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  Escape local_38;
  
  poVar1 = std::operator<<(os,"\"");
  std::__cxx11::string::string((string *)&local_58,json->object);
  std::__cxx11::string::string((string *)&local_38,&local_58);
  poVar1 = operator<<(poVar1,&local_38);
  poVar1 = std::operator<<(poVar1,"\"");
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return poVar1;
}

Assistant:

std::ostream &
operator << (std::ostream &os, const JSON<std::string, C> &json) {
   return os << "\"" << Escape(json.object) << "\"";
}